

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

string * __thiscall
deqp::gls::DrawTestSpec::primitiveToString_abi_cxx11_
          (string *__return_storage_ptr__,DrawTestSpec *this,Primitive primitive)

{
  char *__s;
  char **ppcVar1;
  allocator<char> local_15;
  Type_conflict1 local_14;
  string *psStack_10;
  Primitive primitive_local;
  
  local_14 = (Type_conflict1)this;
  psStack_10 = __return_storage_ptr__;
  ppcVar1 = de::getSizedArrayElement<11,11,char_const*>(&primitiveToString::primitives,local_14);
  __s = *ppcVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_15)
  ;
  std::allocator<char>::~allocator(&local_15);
  return __return_storage_ptr__;
}

Assistant:

std::string DrawTestSpec::primitiveToString (Primitive primitive)
{
	static const char* primitives[] =
	{
		"points",					// PRIMITIVE_POINTS ,
		"triangles",				// PRIMITIVE_TRIANGLES,
		"triangle_fan",				// PRIMITIVE_TRIANGLE_FAN,
		"triangle_strip",			// PRIMITIVE_TRIANGLE_STRIP,
		"lines",					// PRIMITIVE_LINES
		"line_strip",				// PRIMITIVE_LINE_STRIP
		"line_loop",				// PRIMITIVE_LINE_LOOP
		"lines_adjacency",			// PRIMITIVE_LINES_ADJACENCY
		"line_strip_adjacency",		// PRIMITIVE_LINE_STRIP_ADJACENCY
		"triangles_adjacency",		// PRIMITIVE_TRIANGLES_ADJACENCY
		"triangle_strip_adjacency",	// PRIMITIVE_TRIANGLE_STRIP_ADJACENCY
	};

	return de::getSizedArrayElement<DrawTestSpec::PRIMITIVE_LAST>(primitives, (int)primitive);
}